

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int print_preallocated(cJSON *root)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *__s2;
  size_t __size;
  void *__ptr;
  size_t len_fail;
  size_t len;
  char *buf_fail;
  char *buf;
  char *out;
  cJSON *root_local;
  
  __s = (char *)cJSON_Print(root);
  sVar2 = strlen(__s);
  __s2 = (char *)malloc(sVar2 + 5);
  if (__s2 == (char *)0x0) {
    printf("Failed to allocate memory.\n");
    exit(1);
  }
  __size = strlen(__s);
  __ptr = malloc(__size);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate memory.\n");
    exit(1);
  }
  iVar1 = cJSON_PrintPreallocated(root,__s2,sVar2 + 5 & 0xffffffff,1);
  if (iVar1 == 0) {
    printf("cJSON_PrintPreallocated failed!\n");
    iVar1 = strcmp(__s,__s2);
    if (iVar1 != 0) {
      printf("cJSON_PrintPreallocated not the same as cJSON_Print!\n");
      printf("cJSON_Print result:\n%s\n",__s);
      printf("cJSON_PrintPreallocated result:\n%s\n",__s2);
    }
    free(__s);
    free(__ptr);
    free(__s2);
    root_local._4_4_ = -1;
  }
  else {
    printf("%s\n",__s2);
    iVar1 = cJSON_PrintPreallocated(root,__ptr,__size & 0xffffffff,1);
    if (iVar1 == 0) {
      free(__s);
      free(__ptr);
      free(__s2);
      root_local._4_4_ = 0;
    }
    else {
      printf("cJSON_PrintPreallocated failed to show error with insufficient memory!\n");
      printf("cJSON_Print result:\n%s\n",__s);
      printf("cJSON_PrintPreallocated result:\n%s\n",__ptr);
      free(__s);
      free(__ptr);
      free(__s2);
      root_local._4_4_ = -1;
    }
  }
  return root_local._4_4_;
}

Assistant:

static int print_preallocated(cJSON *root)
{
    /* declarations */
    char *out = NULL;
    char *buf = NULL;
    char *buf_fail = NULL;
    size_t len = 0;
    size_t len_fail = 0;

    /* formatted print */
    out = cJSON_Print(root);

    /* create buffer to succeed */
    /* the extra 5 bytes are because of inaccuracies when reserving memory */
    len = strlen(out) + 5;
    buf = (char*)malloc(len);
    if (buf == NULL)
    {
        printf("Failed to allocate memory.\n");
        exit(1);
    }

    /* create buffer to fail */
    len_fail = strlen(out);
    buf_fail = (char*)malloc(len_fail);
    if (buf_fail == NULL)
    {
        printf("Failed to allocate memory.\n");
        exit(1);
    }

    /* Print to buffer */
    if (!cJSON_PrintPreallocated(root, buf, (int)len, 1)) {
        printf("cJSON_PrintPreallocated failed!\n");
        if (strcmp(out, buf) != 0) {
            printf("cJSON_PrintPreallocated not the same as cJSON_Print!\n");
            printf("cJSON_Print result:\n%s\n", out);
            printf("cJSON_PrintPreallocated result:\n%s\n", buf);
        }
        free(out);
        free(buf_fail);
        free(buf);
        return -1;
    }

    /* success */
    printf("%s\n", buf);

    /* force it to fail */
    if (cJSON_PrintPreallocated(root, buf_fail, (int)len_fail, 1)) {
        printf("cJSON_PrintPreallocated failed to show error with insufficient memory!\n");
        printf("cJSON_Print result:\n%s\n", out);
        printf("cJSON_PrintPreallocated result:\n%s\n", buf_fail);
        free(out);
        free(buf_fail);
        free(buf);
        return -1;
    }

    free(out);
    free(buf_fail);
    free(buf);
    return 0;
}